

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsSealed
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance)

{
  byte bVar1;
  bool bVar2;
  BOOL BVar3;
  IndexPropertyDescriptor *pIVar4;
  ES5Array *arr;
  BOOL BVar5;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  int index;
  
  BVar3 = DictionaryTypeHandlerBase<int>::IsSealed
                    (&this->super_DictionaryTypeHandlerBase<int>,instance);
  BVar5 = 0;
  if (BVar3 != 0) {
    this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
    if (0 < this_00->count - this_00->freeCount) {
      index = 0;
      do {
        pIVar4 = JsUtil::
                 BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt(this_00,index);
        if ((pIVar4->Attributes & 8) == 0) {
          bVar1 = pIVar4->Attributes >> 1;
        }
        else {
          bVar1 = 0;
        }
        if ((bVar1 & 1) != 0) {
          return 0;
        }
        index = index + 1;
        this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
      } while (index < this_00->count - this_00->freeCount);
    }
    if ((this->dataItemAttributes & 2) != 0) {
      arr = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
      bVar2 = HasAnyDataItemNotInMap(this,arr);
      if (bVar2) {
        return 0;
      }
    }
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsSealed(DynamicObject* instance)
    {
        if (!__super::IsSealed(instance))
        {
            return false;
        }

        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            IndexPropertyDescriptor* descriptor = indexPropertyMap->GetReferenceAt(i);
            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip deleted
            }
            if (descriptor->Attributes & PropertyConfigurable)
            {
                //[[Configurable]] must be false for all properties.
                return false;
            }
        }

        // Check data item not in map
        if (this->GetDataItemAttributes() & PropertyConfigurable)
        {
            if (HasAnyDataItemNotInMap(VarTo<ES5Array>(instance)))
            {
                return false;
            }
        }

        return true;
    }